

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall
cmFileLockPool::LockFunctionScope(cmFileLockPool *this,string *filename,unsigned_long timeoutSec)

{
  bool bVar1;
  cmFileLockResult cVar2;
  
  bVar1 = IsAlreadyLocked(this,filename);
  if (bVar1) {
    cVar2 = cmFileLockResult::MakeAlreadyLocked();
    return cVar2;
  }
  if ((cmFileLockPool *)
      (this->FunctionScopes).
      super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>.
      _M_impl._M_node.super__List_node_base._M_next != this) {
    cVar2 = ScopePool::Lock((ScopePool *)
                            (this->FunctionScopes).
                            super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                            ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,filename,
                            timeoutSec);
    return cVar2;
  }
  cVar2 = cmFileLockResult::MakeNoFunction();
  return cVar2;
}

Assistant:

cmFileLockResult cmFileLockPool::LockFunctionScope(
    const std::string& filename, unsigned long timeoutSec)
{
  if (this->IsAlreadyLocked(filename))
    {
    return cmFileLockResult::MakeAlreadyLocked();
    }
  if (this->FunctionScopes.empty())
    {
    return cmFileLockResult::MakeNoFunction();
    }
  return this->FunctionScopes.back()->Lock(filename, timeoutSec);
}